

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

int xmlVRaiseError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,void *ctx,
                  xmlNode *node,int domain,int code,xmlErrorLevel level,char *file,int line,
                  char *str1,char *str2,char *str3,int int1,int col,char *msg,__va_list_tag *ap)

{
  xmlStructuredErrorFunc p_Var1;
  xmlGenericErrorFunc channel_00;
  int iVar2;
  xmlError *to_00;
  int *piVar3;
  xmlStructuredErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlGenericErrorFunc *pp_Var6;
  xmlError *local_80;
  xmlErrorPtr to;
  xmlErrorPtr lastError;
  xmlParserCtxtPtr ctxt;
  int domain_local;
  xmlNode *node_local;
  void *ctx_local;
  void *data_local;
  xmlGenericErrorFunc channel_local;
  xmlStructuredErrorFunc schannel_local;
  
  lastError = (xmlErrorPtr)0x0;
  to_00 = xmlGetLastErrorInternal();
  if (code == 0) {
    schannel_local._4_4_ = 0;
  }
  else {
    piVar3 = __xmlGetWarningsDefaultValue();
    if ((*piVar3 == 0) && (level == XML_ERR_WARNING)) {
      schannel_local._4_4_ = 0;
    }
    else {
      local_80 = to_00;
      if ((((domain == 1) || (((domain == 5 || (domain == 4)) || (domain == 3)))) ||
          ((domain == 8 || (domain == 0x17)))) && (lastError = (xmlErrorPtr)ctx, ctx != (void *)0x0)
         ) {
        local_80 = (xmlError *)((long)ctx + 600);
      }
      iVar2 = xmlVUpdateError(local_80,lastError,node,domain,code,level,file,line,str1,str2,str3,
                              int1,col,msg,ap);
      if (iVar2 == 0) {
        if ((local_80 == to_00) || (iVar2 = xmlCopyError(local_80,to_00), -1 < iVar2)) {
          if (schannel == (xmlStructuredErrorFunc)0x0) {
            pp_Var4 = __xmlStructuredError();
            if (*pp_Var4 == (xmlStructuredErrorFunc)0x0) {
              if (channel != (xmlGenericErrorFunc)0x0) {
                if ((((channel == xmlGenericErrorDefaultFunc) || (channel == xmlParserError)) ||
                    (channel == xmlParserWarning)) ||
                   ((channel == xmlParserValidityError || (channel == xmlParserValidityWarning)))) {
                  pp_Var6 = __xmlGenericError();
                  channel_00 = *pp_Var6;
                  ppvVar5 = __xmlGenericErrorContext();
                  xmlFormatError(local_80,channel_00,*ppvVar5);
                }
                else {
                  (*channel)(data,"%s",local_80->message);
                }
              }
            }
            else {
              pp_Var4 = __xmlStructuredError();
              p_Var1 = *pp_Var4;
              ppvVar5 = __xmlStructuredErrorContext();
              (*p_Var1)(*ppvVar5,local_80);
            }
          }
          else {
            (*schannel)(data,local_80);
          }
          schannel_local._4_4_ = 0;
        }
        else {
          schannel_local._4_4_ = -1;
        }
      }
      else {
        schannel_local._4_4_ = -1;
      }
    }
  }
  return schannel_local._4_4_;
}

Assistant:

int
xmlVRaiseError(xmlStructuredErrorFunc schannel,
               xmlGenericErrorFunc channel, void *data, void *ctx,
               xmlNode *node, int domain, int code, xmlErrorLevel level,
               const char *file, int line, const char *str1,
               const char *str2, const char *str3, int int1, int col,
               const char *msg, va_list ap)
{
    xmlParserCtxtPtr ctxt = NULL;
    /* xmlLastError is a macro retrieving the per-thread global. */
    xmlErrorPtr lastError = xmlGetLastErrorInternal();
    xmlErrorPtr to = lastError;

    if (code == XML_ERR_OK)
        return(0);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (code == XML_ERR_INTERNAL_ERROR)
        xmlAbort("Unexpected error: %d\n", code);
#endif
    if ((xmlGetWarningsDefaultValue == 0) && (level == XML_ERR_WARNING))
        return(0);

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = (xmlParserCtxtPtr) ctx;

        if (ctxt != NULL)
            to = &ctxt->lastError;
    }

    if (xmlVUpdateError(to, ctxt, node, domain, code, level, file, line,
                        str1, str2, str3, int1, col, msg, ap))
        return(-1);

    if (to != lastError) {
        if (xmlCopyError(to, lastError) < 0)
            return(-1);
    }

    if (schannel != NULL) {
	schannel(data, to);
    } else if (xmlStructuredError != NULL) {
        xmlStructuredError(xmlStructuredErrorContext, to);
    } else if (channel != NULL) {
        /* Don't invoke legacy error handlers */
        if ((channel == xmlGenericErrorDefaultFunc) ||
            (channel == xmlParserError) ||
            (channel == xmlParserWarning) ||
            (channel == xmlParserValidityError) ||
            (channel == xmlParserValidityWarning))
            xmlFormatError(to, xmlGenericError, xmlGenericErrorContext);
        else
	    channel(data, "%s", to->message);
    }

    return(0);
}